

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcreat.c
# Opt level: O3

MATRIX mat_fill(MATRIX A,int type)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  
  auVar5 = _DAT_00103010;
  auVar4 = _DAT_00103000;
  if (((uint)type < 2) && (iVar1 = *(int *)(A + -1), 0 < (long)iVar1)) {
    uVar2 = *(uint *)((long)A + -4);
    lVar6 = (ulong)uVar2 - 1;
    auVar9._8_4_ = (int)lVar6;
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_00103010;
    do {
      if (0 < (int)uVar2) {
        pdVar3 = A[uVar7];
        uVar8 = 0;
        auVar10 = auVar4;
        do {
          auVar11 = auVar10 ^ auVar5;
          if ((bool)(~(auVar9._4_4_ < auVar11._4_4_ ||
                      auVar9._0_4_ < auVar11._0_4_ && auVar11._4_4_ == auVar9._4_4_) & 1)) {
            dVar12 = 1.0;
            if (uVar7 != uVar8) {
              dVar12 = 0.0;
            }
            if (type != 1) {
              dVar12 = 0.0;
            }
            pdVar3[uVar8] = dVar12;
          }
          if (auVar11._12_4_ <= auVar9._12_4_ &&
              (auVar11._8_4_ <= auVar9._8_4_ || auVar11._12_4_ != auVar9._12_4_)) {
            dVar12 = 1.0;
            if (uVar7 - 1 != uVar8) {
              dVar12 = 0.0;
            }
            if (type != 1) {
              dVar12 = 0.0;
            }
            pdVar3[uVar8 + 1] = dVar12;
          }
          uVar8 = uVar8 + 2;
          lVar6 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar6 + 2;
        } while ((uVar2 + 1 & 0xfffffffe) != uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (long)iVar1);
  }
  return A;
}

Assistant:

MATRIX mat_fill( MATRIX A, int type )
{
	int	i, j;

	switch (type)
		{
		case UNDEFINED:
			break;
		case ZERO_MATRIX:
		case UNIT_MATRIX:
			for (i=0; i<MatRow(A); i++)
			for (j=0; j<MatCol(A); j++)
				{
				if (type == UNIT_MATRIX)
					{
					if (i==j)
						{
						A[i][j] = 1.0;
						continue;
						}
					}
				A[i][j] = 0.0;
				}
			break;
		}
	return (A);
}